

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFindPackageCommand::CheckVersionFile
          (cmFindPackageCommand *this,string *version_file,string *result_version)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint parsed_minor;
  uint parsed_major;
  char buf [64];
  uint parsed_tweak;
  uint parsed_patch;
  PolicyPushPop polScope;
  ScopePushPop varScope;
  uint local_ac;
  string local_a8;
  string local_88 [2];
  uint local_40;
  uint local_3c;
  PolicyPushPop local_38;
  ScopePushPop local_30;
  
  local_30.Makefile = (this->super_cmFindCommon).super_cmCommand.Makefile;
  cmMakefile::PushScope(local_30.Makefile);
  cmMakefile::PolicyPushPop::PolicyPushPop
            (&local_38,(this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)local_88,"PACKAGE_VERSION",(allocator *)&local_a8);
  cmMakefile::RemoveDefinition(pcVar1,local_88);
  std::__cxx11::string::~string((string *)local_88);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)local_88,"PACKAGE_VERSION_UNSUITABLE",(allocator *)&local_a8);
  cmMakefile::RemoveDefinition(pcVar1,local_88);
  std::__cxx11::string::~string((string *)local_88);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)local_88,"PACKAGE_VERSION_COMPATIBLE",(allocator *)&local_a8);
  cmMakefile::RemoveDefinition(pcVar1,local_88);
  std::__cxx11::string::~string((string *)local_88);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)local_88,"PACKAGE_VERSION_EXACT",(allocator *)&local_a8);
  cmMakefile::RemoveDefinition(pcVar1,local_88);
  std::__cxx11::string::~string((string *)local_88);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)local_88,"PACKAGE_FIND_NAME",(allocator *)&local_a8);
  cmMakefile::AddDefinition(pcVar1,local_88,(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)local_88);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)local_88,"PACKAGE_FIND_VERSION",(allocator *)&local_a8);
  cmMakefile::AddDefinition(pcVar1,local_88,(this->Version)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)local_88);
  sprintf((char *)local_88,"%u",(ulong)this->VersionMajor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&local_a8,"PACKAGE_FIND_VERSION_MAJOR",(allocator *)&local_ac);
  cmMakefile::AddDefinition(pcVar1,&local_a8,(char *)local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  sprintf((char *)local_88,"%u",(ulong)this->VersionMinor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&local_a8,"PACKAGE_FIND_VERSION_MINOR",(allocator *)&local_ac);
  cmMakefile::AddDefinition(pcVar1,&local_a8,(char *)local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  sprintf((char *)local_88,"%u",(ulong)this->VersionPatch);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&local_a8,"PACKAGE_FIND_VERSION_PATCH",(allocator *)&local_ac);
  cmMakefile::AddDefinition(pcVar1,&local_a8,(char *)local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  sprintf((char *)local_88,"%u",(ulong)this->VersionTweak);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&local_a8,"PACKAGE_FIND_VERSION_TWEAK",(allocator *)&local_ac);
  cmMakefile::AddDefinition(pcVar1,&local_a8,(char *)local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  sprintf((char *)local_88,"%u",(ulong)this->VersionCount);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)&local_a8,"PACKAGE_FIND_VERSION_COUNT",(allocator *)&local_ac);
  cmMakefile::AddDefinition(pcVar1,&local_a8,(char *)local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar2 = ReadListFile(this,(version_file->_M_dataplus)._M_p,NoPolicyScope);
  if (bVar2) {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    std::__cxx11::string::string((string *)&local_a8,"PACKAGE_VERSION_EXACT",(allocator *)&local_ac)
    ;
    bVar2 = cmMakefile::IsOn(pcVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    std::__cxx11::string::string
              ((string *)&local_a8,"PACKAGE_VERSION_UNSUITABLE",(allocator *)&local_ac);
    bVar3 = cmMakefile::IsOn(pcVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar2) {
LAB_002c0683:
      if (bVar3) goto LAB_002c0752;
    }
    else {
      if (this->VersionExact == false) {
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::string::string
                  ((string *)&local_a8,"PACKAGE_VERSION_COMPATIBLE",(allocator *)&local_ac);
        bVar2 = cmMakefile::IsOn(pcVar1,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      else {
        bVar2 = false;
      }
      if (bVar2 != false || bVar3) goto LAB_002c0683;
      if ((this->Version)._M_string_length != 0) goto LAB_002c0752;
    }
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    std::__cxx11::string::string((string *)&local_a8,"PACKAGE_VERSION",(allocator *)&local_ac);
    cmMakefile::GetSafeDefinition(pcVar1,&local_a8);
    std::__cxx11::string::assign((char *)&this->VersionFound);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar4 = __isoc99_sscanf((this->VersionFound)._M_dataplus._M_p,"%u.%u.%u.%u",&local_a8,&local_ac,
                            &local_3c,&local_40);
    this->VersionFoundCount = uVar4;
    switch(uVar4) {
    case 4:
      this->VersionFoundTweak = local_40;
    case 3:
      this->VersionFoundPatch = local_3c;
    case 2:
      this->VersionFoundMinor = local_ac;
    case 1:
      this->VersionFoundMajor = (uint)local_a8._M_dataplus._M_p;
    default:
      bVar2 = true;
    }
  }
  else {
LAB_002c0752:
    bVar2 = false;
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)&local_a8,"PACKAGE_VERSION",(allocator *)&local_ac);
  cmMakefile::GetSafeDefinition(pcVar1,&local_a8);
  std::__cxx11::string::assign((char *)result_version);
  std::__cxx11::string::~string((string *)&local_a8);
  if (result_version->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)result_version);
  }
  cmMakefile::PolicyPushPop::~PolicyPushPop(&local_38);
  cmMakefile::ScopePushPop::~ScopePushPop(&local_30);
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::CheckVersionFile(std::string const& version_file,
                                            std::string& result_version)
{
  // The version file will be loaded in an isolated scope.
  cmMakefile::ScopePushPop varScope(this->Makefile);
  cmMakefile::PolicyPushPop polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  // Clear the output variables.
  this->Makefile->RemoveDefinition("PACKAGE_VERSION");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_UNSUITABLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_COMPATIBLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_EXACT");

  // Set the input variables.
  this->Makefile->AddDefinition("PACKAGE_FIND_NAME", this->Name.c_str());
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION",
                                this->Version.c_str());
  char buf[64];
  sprintf(buf, "%u", this->VersionMajor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MAJOR", buf);
  sprintf(buf, "%u", this->VersionMinor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MINOR", buf);
  sprintf(buf, "%u", this->VersionPatch);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_PATCH", buf);
  sprintf(buf, "%u", this->VersionTweak);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_TWEAK", buf);
  sprintf(buf, "%u", this->VersionCount);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_COUNT", buf);

  // Load the version check file.  Pass NoPolicyScope because we do
  // our own policy push/pop independent of CMP0011.
  bool suitable = false;
  if(this->ReadListFile(version_file.c_str(), NoPolicyScope))
    {
    // Check the output variables.
    bool okay = this->Makefile->IsOn("PACKAGE_VERSION_EXACT");
    bool unsuitable = this->Makefile->IsOn("PACKAGE_VERSION_UNSUITABLE");
    if(!okay && !this->VersionExact)
      {
      okay = this->Makefile->IsOn("PACKAGE_VERSION_COMPATIBLE");
      }

    // The package is suitable if the version is okay and not
    // explicitly unsuitable.
    suitable = !unsuitable && (okay || this->Version.empty());
    if(suitable)
      {
      // Get the version found.
      this->VersionFound =
        this->Makefile->GetSafeDefinition("PACKAGE_VERSION");

      // Try to parse the version number and store the results that were
      // successfully parsed.
      unsigned int parsed_major;
      unsigned int parsed_minor;
      unsigned int parsed_patch;
      unsigned int parsed_tweak;
      this->VersionFoundCount =
        sscanf(this->VersionFound.c_str(), "%u.%u.%u.%u",
               &parsed_major, &parsed_minor,
               &parsed_patch, &parsed_tweak);
      switch(this->VersionFoundCount)
        {
        case 4: this->VersionFoundTweak = parsed_tweak; // no break!
        case 3: this->VersionFoundPatch = parsed_patch; // no break!
        case 2: this->VersionFoundMinor = parsed_minor; // no break!
        case 1: this->VersionFoundMajor = parsed_major; // no break!
        default: break;
        }
      }
    }

  result_version = this->Makefile->GetSafeDefinition("PACKAGE_VERSION");
  if (result_version.empty())
    {
    result_version = "unknown";
    }

  // Succeed if the version is suitable.
  return suitable;
}